

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtfmtsym.cpp
# Opt level: O2

void icu_63::DateFormatSymbols::assignArray
               (UnicodeString **dstArray,int32_t *dstCount,UnicodeString *srcArray,int32_t srcCount)

{
  UnicodeString *pUVar1;
  ulong uVar2;
  ulong uVar3;
  
  *dstCount = srcCount;
  pUVar1 = newUnicodeStringArray((long)srcCount);
  *dstArray = pUVar1;
  if (pUVar1 != (UnicodeString *)0x0) {
    uVar3 = 0;
    uVar2 = (ulong)(uint)srcCount;
    if (srcCount < 1) {
      uVar2 = uVar3;
    }
    for (; uVar2 * 0x40 != uVar3; uVar3 = uVar3 + 0x40) {
      icu_63::UnicodeString::fastCopyFrom
                ((UnicodeString *)
                 ((long)&((*dstArray)->super_Replaceable).super_UObject._vptr_UObject + uVar3),
                 (UnicodeString *)
                 ((long)&(srcArray->super_Replaceable).super_UObject._vptr_UObject + uVar3));
    }
  }
  return;
}

Assistant:

void
DateFormatSymbols::assignArray(UnicodeString*& dstArray,
                               int32_t& dstCount,
                               const UnicodeString* srcArray,
                               int32_t srcCount)
{
    // assignArray() is only called by copyData() and initializeData(), which in turn
    // implements the copy constructor and the assignment operator.
    // All strings in a DateFormatSymbols object are created in one of the following
    // three ways that all allow to safely use UnicodeString::fastCopyFrom():
    // - readonly-aliases from resource bundles
    // - readonly-aliases or allocated strings from constants
    // - safely cloned strings (with owned buffers) from setXYZ() functions
    //
    // Note that this is true for as long as DateFormatSymbols can be constructed
    // only from a locale bundle or set via the cloning API,
    // *and* for as long as all the strings are in *private* fields, preventing
    // a subclass from creating these strings in an "unsafe" way (with respect to fastCopyFrom()).
    dstCount = srcCount;
    dstArray = newUnicodeStringArray(srcCount);
    if(dstArray != NULL) {
        int32_t i;
        for(i=0; i<srcCount; ++i) {
            dstArray[i].fastCopyFrom(srcArray[i]);
        }
    }
}